

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> * __thiscall
kj::_::
NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
::emplace<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
          (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
           *this,Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                 *params)

{
  Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *params_00;
  Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *params_local;
  NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
  *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
             )0x0;
    dtor<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                *)(this + 8));
  }
  params_00 = fwd<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
                        (params);
  ctor<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *)
             (this + 8),params_00);
  *this = (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
           )0x1;
  return (Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *)
         (this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }